

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O3

int16_t object_weight_one(object *obj)

{
  uint uVar1;
  int16_t iVar2;
  ushort uVar3;
  angband_constants *paVar5;
  ulong uVar6;
  uint uVar4;
  
  uVar1._0_2_ = obj->weight;
  uVar1._2_1_ = obj->dd;
  uVar1._3_1_ = obj->ds;
  uVar4 = 0;
  if (0 < (short)(undefined2)uVar1) {
    uVar4 = uVar1;
  }
  iVar2 = (int16_t)uVar4;
  if ((obj->curses != (curse_data *)0x0) && (1 < z_info->curse_max)) {
    uVar6 = 1;
    paVar5 = z_info;
    do {
      if (obj->curses[uVar6].power != L'\0') {
        uVar3 = modify_weight_for_curse((wchar_t)uVar6,(int16_t)uVar4);
        uVar4 = (uint)uVar3;
        paVar5 = z_info;
      }
      iVar2 = (int16_t)uVar4;
      uVar6 = uVar6 + 1;
    } while (uVar6 < paVar5->curse_max);
  }
  return iVar2;
}

Assistant:

int16_t object_weight_one(const struct object *obj)
{
	int16_t result = MAX(obj->weight, 0);

	if (obj->curses) {
		int i;

		for (i = 1; i < z_info->curse_max; ++i) {
			if (obj->curses[i].power) {
				result = modify_weight_for_curse(i, result);
			}
		}
	}

	return result;
}